

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O2

Mat * __thiscall
ncnn::ModelBinFromDataReader::load
          (Mat *__return_storage_ptr__,ModelBinFromDataReader *this,int w,int type)

{
  long lVar1;
  DataReader *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  ulong uVar5;
  char *__format;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  vector<unsigned_short,_std::allocator<unsigned_short>_> float16_weights;
  Mat m;
  anon_union_4_2_77b30072 flag_struct;
  void *refbuf;
  vector<signed_char,_std::allocator<signed_char>_> int8_weights;
  long lVar4;
  
  m.cstep = 0;
  m.data = (void *)0x0;
  m.refcount._0_4_ = 0;
  m.refcount._4_4_ = 0;
  m.elemsize._0_4_ = 0;
  m._20_8_ = 0;
  m.allocator = (Allocator *)0x0;
  m.dims = 0;
  m.w = 0;
  m.h = 0;
  m.d = 0;
  m.c = 0;
  if (type == 1) {
    float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    pDVar2 = this->d->dr;
    lVar1 = (long)w * 4;
    iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
    if (CONCAT44(extraout_var_01,iVar3) == lVar1) {
      int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)float16_weights.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_start;
      int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
      Mat::operator=(&m,(Mat *)&int8_weights);
      Mat::~Mat((Mat *)&int8_weights);
    }
    else {
      Mat::create(&m,w,4,(Allocator *)0x0);
      if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
        pDVar2 = this->d->dr;
        iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,m.data,lVar1);
        lVar4 = CONCAT44(extraout_var_02,iVar3);
        if (lVar4 != lVar1) {
LAB_001421d7:
          __format = "ModelBin read weight_data failed %zd";
          goto LAB_00142161;
        }
      }
    }
    Mat::Mat(__return_storage_ptr__,&m);
    goto LAB_00141cda;
  }
  if (type == 0) {
    pDVar2 = this->d->dr;
    iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&flag_struct,4);
    lVar4 = CONCAT44(extraout_var,iVar3);
    if (lVar4 == 4) {
      if (flag_struct.tag == 0x2c056) {
        float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        pDVar2 = this->d->dr;
        lVar1 = (long)w * 4;
        iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
        if (CONCAT44(extraout_var_04,iVar3) == lVar1) {
          int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)float16_weights.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start;
          int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
          Mat::operator=(&m,(Mat *)&int8_weights);
          Mat::~Mat((Mat *)&int8_weights);
        }
        else {
          Mat::create(&m,w,4,(Allocator *)0x0);
          if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,m.data,lVar1);
            lVar4 = CONCAT44(extraout_var_08,iVar3);
            if (lVar4 != lVar1) goto LAB_001421d7;
          }
        }
        Mat::Mat(__return_storage_ptr__,&m);
        goto LAB_00141cda;
      }
      if (flag_struct.tag != 0xd4b38) {
        if (flag_struct.tag == 0x1306b47) {
          refbuf = (void *)0x0;
          uVar6 = (long)w * 2 + 3U & 0xfffffffffffffffc;
          pDVar2 = this->d->dr;
          iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,uVar6);
          if (CONCAT44(extraout_var_00,iVar3) == uVar6) {
            Mat::from_float16((Mat *)&int8_weights,(unsigned_short *)refbuf,w);
            Mat::operator=(&m,(Mat *)&int8_weights);
            Mat::~Mat((Mat *)&int8_weights);
          }
          else {
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                      (&float16_weights,uVar6);
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])
                              (pDVar2,float16_weights.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_start,uVar6);
            uVar7 = CONCAT44(extraout_var_09,iVar3);
            if (uVar7 == uVar6) {
              Mat::from_float16((Mat *)&int8_weights,
                                float16_weights.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start,w);
              Mat::operator=(&m,(Mat *)&int8_weights);
              Mat::~Mat((Mat *)&int8_weights);
            }
            else {
              fprintf(_stderr,"ModelBin read float16_weights failed %zd",uVar7);
              fputc(10,_stderr);
              __return_storage_ptr__->cstep = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->d = 0;
              __return_storage_ptr__->c = 0;
            }
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&float16_weights.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
            if (uVar7 != uVar6) goto LAB_00141cda;
          }
          Mat::Mat(__return_storage_ptr__,&m);
          goto LAB_00141cda;
        }
        if ((flag_struct.tag >> 0x10 & 0xff) +
            (flag_struct.tag >> 8 & 0xff) + (flag_struct.tag & 0xff) == 0 &&
            flag_struct.tag >> 0x18 == 0) {
          if (flag_struct.field_0.f0 == '\0') {
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            pDVar2 = this->d->dr;
            lVar1 = (long)w * 4;
            iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,lVar1);
            if (CONCAT44(extraout_var_10,iVar3) == lVar1) {
              int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)float16_weights.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x4;
              Mat::operator=(&m,(Mat *)&int8_weights);
              Mat::~Mat((Mat *)&int8_weights);
            }
            else {
              Mat::create(&m,w,4,(Allocator *)0x0);
              if ((m.data == (void *)0x0) || ((long)m.c * m.cstep == 0)) {
                Mat::Mat(__return_storage_ptr__,&m);
                goto LAB_00141cda;
              }
              pDVar2 = this->d->dr;
              iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,m.data,lVar1);
              lVar4 = CONCAT44(extraout_var_11,iVar3);
              if (lVar4 != lVar1) goto LAB_001421d7;
            }
          }
        }
        else {
          Mat::create(&m,w,4,(Allocator *)0x0);
          if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])(pDVar2,&int8_weights,0x400);
            lVar4 = CONCAT44(extraout_var_05,iVar3);
            if (lVar4 != 0x400) {
              __format = "ModelBin read quantization_value failed %zd";
              goto LAB_00142161;
            }
            uVar7 = (long)w + 3U & 0xfffffffffffffffc;
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&float16_weights,
                       uVar7);
            pDVar2 = this->d->dr;
            iVar3 = (*pDVar2->_vptr_DataReader[3])
                              (pDVar2,float16_weights.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_start,uVar7);
            uVar6 = CONCAT44(extraout_var_06,iVar3);
            if (uVar6 == uVar7) {
              uVar5 = 0;
              uVar8 = (ulong)(uint)w;
              if (w < 1) {
                uVar8 = uVar5;
              }
              for (; uVar8 != uVar5; uVar5 = uVar5 + 1) {
                *(undefined4 *)((long)m.data + uVar5 * 4) =
                     *(undefined4 *)
                      ((long)&int8_weights.
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_start +
                      (ulong)*(byte *)((long)float16_weights.
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl.super__Vector_impl_data._M_start + uVar5) * 4)
                ;
              }
            }
            else {
              fprintf(_stderr,"ModelBin read index_array failed %zd",uVar6);
              fputc(10,_stderr);
              __return_storage_ptr__->cstep = 0;
              __return_storage_ptr__->data = (void *)0x0;
              __return_storage_ptr__->refcount = (int *)0x0;
              *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
              *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
              __return_storage_ptr__->allocator = (Allocator *)0x0;
              __return_storage_ptr__->dims = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->w = 0;
              __return_storage_ptr__->h = 0;
              __return_storage_ptr__->d = 0;
              __return_storage_ptr__->c = 0;
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &float16_weights);
            if (uVar6 != uVar7) goto LAB_00141cda;
          }
        }
        Mat::Mat(__return_storage_ptr__,&m);
        goto LAB_00141cda;
      }
      float16_weights.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      uVar6 = (long)w + 3U & 0xfffffffffffffffc;
      pDVar2 = this->d->dr;
      iVar3 = (*pDVar2->_vptr_DataReader[4])(pDVar2,uVar6);
      if (CONCAT44(extraout_var_03,iVar3) == uVar6) {
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)float16_weights.
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_start;
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
        Mat::operator=(&m,(Mat *)&int8_weights);
        Mat::~Mat((Mat *)&int8_weights);
LAB_00141f8e:
        Mat::Mat(__return_storage_ptr__,&m);
      }
      else {
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<signed_char,_std::allocator<signed_char>_>::resize(&int8_weights,uVar6);
        pDVar2 = this->d->dr;
        iVar3 = (*pDVar2->_vptr_DataReader[3])
                          (pDVar2,int8_weights.
                                  super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,uVar6);
        if (CONCAT44(extraout_var_07,iVar3) == uVar6) {
          Mat::create(&m,w,1,(Allocator *)0x0);
          if ((m.data != (void *)0x0) && ((long)m.c * m.cstep != 0)) {
            memcpy(m.data,int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,(long)w);
            std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                      (&int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
            goto LAB_00141f8e;
          }
          Mat::Mat(__return_storage_ptr__,&m);
        }
        else {
          fprintf(_stderr,"ModelBin read int8_weights failed %zd",CONCAT44(extraout_var_07,iVar3));
          fputc(10,_stderr);
          __return_storage_ptr__->cstep = 0;
          __return_storage_ptr__->data = (void *)0x0;
          __return_storage_ptr__->refcount = (int *)0x0;
          *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
          *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
          __return_storage_ptr__->allocator = (Allocator *)0x0;
          __return_storage_ptr__->dims = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->w = 0;
          __return_storage_ptr__->h = 0;
          __return_storage_ptr__->d = 0;
          __return_storage_ptr__->c = 0;
        }
        std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
                  (&int8_weights.super__Vector_base<signed_char,_std::allocator<signed_char>_>);
      }
      goto LAB_00141cda;
    }
    __format = "ModelBin read flag_struct failed %zd";
LAB_00142161:
    fprintf(_stderr,__format,lVar4);
  }
  else {
    fprintf(_stderr,"ModelBin load type %d not implemented",(ulong)(uint)type);
  }
  fputc(10,_stderr);
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
LAB_00141cda:
  Mat::~Mat(&m);
  return __return_storage_ptr__;
}

Assistant:

Mat ModelBinFromDataReader::load(int w, int type) const
{
    Mat m;

    if (type == 0)
    {
        size_t nread;

        union
        {
            struct
            {
                unsigned char f0;
                unsigned char f1;
                unsigned char f2;
                unsigned char f3;
            };
            unsigned int tag;
        } flag_struct;

        nread = d->dr.read(&flag_struct, sizeof(flag_struct));
        if (nread != sizeof(flag_struct))
        {
            NCNN_LOGE("ModelBin read flag_struct failed %zd", nread);
            return Mat();
        }

        unsigned int flag = flag_struct.f0 + flag_struct.f1 + flag_struct.f2 + flag_struct.f3;

        if (flag_struct.tag == 0x01306B47)
        {
            // half-precision data
            size_t align_data_size = alignSize(w * sizeof(unsigned short), 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat::from_float16((const unsigned short*)refbuf, w);
            }
            else
            {
                std::vector<unsigned short> float16_weights;
                float16_weights.resize(align_data_size);
                nread = d->dr.read(float16_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read float16_weights failed %zd", nread);
                    return Mat();
                }

                m = Mat::from_float16(float16_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x000D4B38)
        {
            // int8 data
            size_t align_data_size = alignSize(w, 4);

            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(align_data_size, &refbuf);
            if (nread == align_data_size)
            {
                m = Mat(w, (void*)refbuf, (size_t)1u);
            }
            else
            {
                std::vector<signed char> int8_weights;
                int8_weights.resize(align_data_size);
                nread = d->dr.read(int8_weights.data(), align_data_size);
                if (nread != align_data_size)
                {
                    NCNN_LOGE("ModelBin read int8_weights failed %zd", nread);
                    return Mat();
                }

                m.create(w, (size_t)1u);
                if (m.empty())
                    return m;

                memcpy(m.data, int8_weights.data(), w);
            }

            return m;
        }
        else if (flag_struct.tag == 0x0002C056)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data with extra scaling
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }

            return m;
        }

        if (flag != 0)
        {
            m.create(w);
            if (m.empty())
                return m;

            // quantized data
            float quantization_value[256];
            nread = d->dr.read(quantization_value, 256 * sizeof(float));
            if (nread != 256 * sizeof(float))
            {
                NCNN_LOGE("ModelBin read quantization_value failed %zd", nread);
                return Mat();
            }

            size_t align_weight_data_size = alignSize(w * sizeof(unsigned char), 4);
            std::vector<unsigned char> index_array;
            index_array.resize(align_weight_data_size);
            nread = d->dr.read(index_array.data(), align_weight_data_size);
            if (nread != align_weight_data_size)
            {
                NCNN_LOGE("ModelBin read index_array failed %zd", nread);
                return Mat();
            }

            float* ptr = m;
            for (int i = 0; i < w; i++)
            {
                ptr[i] = quantization_value[index_array[i]];
            }
        }
        else if (flag_struct.f0 == 0)
        {
            // try reference data
            const void* refbuf = 0;
            nread = d->dr.reference(w * sizeof(float), &refbuf);
            if (nread == w * sizeof(float))
            {
                m = Mat(w, (void*)refbuf);
            }
            else
            {
                m.create(w);
                if (m.empty())
                    return m;

                // raw data
                nread = d->dr.read(m, w * sizeof(float));
                if (nread != w * sizeof(float))
                {
                    NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                    return Mat();
                }
            }
        }

        return m;
    }
    else if (type == 1)
    {
        // try reference data
        const void* refbuf = 0;
        size_t nread = d->dr.reference(w * sizeof(float), &refbuf);
        if (nread == w * sizeof(float))
        {
            m = Mat(w, (void*)refbuf);
        }
        else
        {
            m.create(w);
            if (m.empty())
                return m;

            // raw data
            size_t nread = d->dr.read(m, w * sizeof(float));
            if (nread != w * sizeof(float))
            {
                NCNN_LOGE("ModelBin read weight_data failed %zd", nread);
                return Mat();
            }
        }

        return m;
    }
    else
    {
        NCNN_LOGE("ModelBin load type %d not implemented", type);
        return Mat();
    }

    return Mat();
}